

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::UniformCase::init(UniformCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  int iVar6;
  int combinedTexUnitsSupported;
  int fragmentTexUnitsSupported;
  int vertexTexUnitsSupported;
  int combinedTexUnitsRequired;
  int fragmentTexUnitsRequired;
  int vertexTexUnitsRequired;
  int val;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  UniformCase *local_38;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  iVar3 = anon_unknown_1::UniformCollection::getNumSamplers((this->m_uniformCollection).m_ptr);
  iVar6 = 0;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    iVar6 = iVar3;
  }
  if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
    iVar3 = 0;
  }
  val = -1;
  combinedTexUnitsRequired = iVar3 + iVar6;
  fragmentTexUnitsRequired = iVar3;
  vertexTexUnitsRequired = iVar6;
  local_38 = this;
  (**(code **)(lVar4 + 0x868))(0x8b4c,&val);
  iVar1 = val;
  vertexTexUnitsSupported = val;
  val = -1;
  (**(code **)(lVar4 + 0x868))(0x8872,&val);
  iVar2 = val;
  fragmentTexUnitsSupported = val;
  val = -1;
  (**(code **)(lVar4 + 0x868))(0x8b4d,&val);
  combinedTexUnitsSupported = val;
  if (iVar1 < iVar6) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_98,&vertexTexUnitsRequired);
    std::operator+(&local_78,&local_98," vertex texture units required, ");
    de::toString<int>(&local_b8,&vertexTexUnitsSupported);
    std::operator+(&local_58,&local_78,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   &local_58," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&val);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar2 < iVar3) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_98,&fragmentTexUnitsRequired);
    std::operator+(&local_78,&local_98," fragment texture units required, ");
    de::toString<int>(&local_b8,&fragmentTexUnitsSupported);
    std::operator+(&local_58,&local_78,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   &local_58," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&val);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (iVar3 + iVar6 <= val) {
    (local_38->super_CallLogWrapper).m_enableLog = true;
    return (int)local_38;
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_98,&combinedTexUnitsRequired);
  std::operator+(&local_78,&local_98," combined texture units required, ");
  de::toString<int>(&local_b8,&combinedTexUnitsSupported);
  std::operator+(&local_58,&local_78,&local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,&local_58
                 ," supported");
  tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&val);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UniformCase::init (void)
{
	{
		const glw::Functions&	funcs						= m_context.getRenderContext().getFunctions();
		const int				numSamplerUniforms			= m_uniformCollection->getNumSamplers();
		const int				vertexTexUnitsRequired		= m_caseShaderType != CASESHADERTYPE_FRAGMENT ? numSamplerUniforms : 0;
		const int				fragmentTexUnitsRequired	= m_caseShaderType != CASESHADERTYPE_VERTEX ? numSamplerUniforms : 0;
		const int				combinedTexUnitsRequired	= vertexTexUnitsRequired + fragmentTexUnitsRequired;
		const int				vertexTexUnitsSupported		= getGLInt(funcs, GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS);
		const int				fragmentTexUnitsSupported	= getGLInt(funcs, GL_MAX_TEXTURE_IMAGE_UNITS);
		const int				combinedTexUnitsSupported	= getGLInt(funcs, GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS);

		DE_ASSERT(numSamplerUniforms <= MAX_NUM_SAMPLER_UNIFORMS);

		if (vertexTexUnitsRequired > vertexTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(vertexTexUnitsRequired) + " vertex texture units required, " + de::toString(vertexTexUnitsSupported) + " supported");
		if (fragmentTexUnitsRequired > fragmentTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(fragmentTexUnitsRequired) + " fragment texture units required, " + de::toString(fragmentTexUnitsSupported) + " supported");
		if (combinedTexUnitsRequired > combinedTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(combinedTexUnitsRequired) + " combined texture units required, " + de::toString(combinedTexUnitsSupported) + " supported");
	}

	enableLogging(true);
}